

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O3

void __thiscall gnilk::LogManager::~LogManager(LogManager *this)

{
  ~LogManager(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

LogManager::~LogManager() {
    Close();
    logInstances.clear();   // Now we can clear it..
}